

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuItemStaticTextSwitchable::Draw
          (FOptionMenuItemStaticTextSwitchable *this,FOptionMenuDescriptor *desc,int y,int indent,
          bool selected)

{
  int iVar1;
  int iVar2;
  char *local_48;
  int x;
  int w;
  char *txt;
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *desc_local;
  FOptionMenuItemStaticTextSwitchable *this_local;
  
  if (this->mCurrent == 0) {
    local_48 = FString::GetChars(&(this->super_FOptionMenuItem).mLabel);
  }
  else {
    local_48 = FString::GetChars(&this->mAltText);
  }
  _x = local_48;
  if (*local_48 == '$') {
    _x = FStringTable::operator()(&GStrings,local_48 + 1);
  }
  iVar1 = FFont::StringWidth(SmallFont,_x);
  iVar1 = iVar1 * CleanXfac_1;
  iVar2 = DCanvas::GetWidth((DCanvas *)screen);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,*(int *)&(this->super_FOptionMenuItem).field_0x24,
                    (iVar2 - iVar1) / 2,y,_x,0x40001394,1,0);
  return -1;
}

Assistant:

int Draw(FOptionMenuDescriptor *desc, int y, int indent, bool selected)
	{
		const char *txt = mCurrent? mAltText.GetChars() : mLabel.GetChars();
		if (*txt == '$') txt = GStrings(txt + 1);
		int w = SmallFont->StringWidth(txt) * CleanXfac_1;
		int x = (screen->GetWidth() - w) / 2;
		screen->DrawText (SmallFont, mColor, x, y, txt, DTA_CleanNoMove_1, true, TAG_DONE);
		return -1;
	}